

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

_Bool compare_want_contents(Constraint *constraint,CgreenValue actual)

{
  int iVar1;
  long in_RDI;
  void *in_stack_00000010;
  undefined1 local_1;
  
  if (in_stack_00000010 == (void *)0x0) {
    local_1 = false;
  }
  else {
    iVar1 = memcmp(*(void **)(in_RDI + 0x48),in_stack_00000010,*(size_t *)(in_RDI + 0x68));
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool compare_want_contents(Constraint *constraint, CgreenValue actual) {
    /* We can't inspect the contents of a NULL pointer, so comparison always fails */
    /* TODO: This should really be .pointer_value */
    if ((void *)actual.value.integer_value == NULL) {
        return 0;
    }

    return 0 == memcmp(constraint->expected_value.value.pointer_value,
                       (void *)actual.value.integer_value, constraint->size_of_expected_value);
}